

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall
Analyser_twoEquivalentVoiExternalVariablesIncludingPrimaryVariable_Test::TestBody
          (Analyser_twoEquivalentVoiExternalVariablesIncludingPrimaryVariable_Test *this)

{
  pointer pbVar1;
  element_type *peVar2;
  bool bVar3;
  char *pcVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_663;
  allocator<char> local_f9;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  string local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  unsigned_long local_b0 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Vector_base<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>
  local_78;
  AnalyserPtr analyser;
  ModelPtr model;
  ParserPtr parser;
  string local_30 [32];
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",
             (allocator<char> *)&expectedIssues);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_b0);
  local_b0[0] = 0;
  expectedIssues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",local_b0,
             (unsigned_long *)&expectedIssues);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expectedIssues,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x285,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expectedIssues,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expectedIssues);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,
             "Both variable \'time\' in component \'environment\' and variable \'time\' in component \'membrane\' are marked as external variables, but they are equivalent to variable \'time\' in component \'environment\', the primary variable of integration which cannot be used as an external variable."
             ,(allocator<char> *)local_b0);
  __l._M_len = 1;
  __l._M_array = (iterator)&gtest_ar;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expectedIssues,__l,(allocator_type *)&local_78);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Analyser::create();
  bVar3 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  peVar2 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"environment",(allocator<char> *)&gtest_trace_663);
  libcellml::ComponentEntity::component(local_c0,bVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"time",&local_f9);
  libcellml::Component::variable((string *)&local_90);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_78);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_78._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_90.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar2 = analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"membrane",(allocator<char> *)&gtest_trace_663);
  libcellml::ComponentEntity::component
            (local_c0,(bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_1_);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"time",&local_f9);
  libcellml::Component::variable((string *)&local_90);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_78);
  libcellml::Analyser::addExternalVariable((shared_ptr *)peVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_78._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_90.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Analyser::analyseModel
            ((shared_ptr *)
             analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_663,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
             ,0x297,"Issue occurred here.");
  expectedCellmlElementTypes
            ((ulong)&gtest_ar,
             (CellmlElementType)
             ((long)expectedIssues.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)expectedIssues.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  expectedLevels((ulong)local_b0,
                 (Level)((long)expectedIssues.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)expectedIssues.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5));
  expectedReferenceRules
            ((ulong)&local_78,
             (ReferenceRule)
             ((long)expectedIssues.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)expectedIssues.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  pbVar1 = expectedIssues.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_EXTERNAL_VARIABLE_VOI"
             ,&local_f9);
  expectedUrls(&local_90,
               (long)expectedIssues.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5,local_30);
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Analyser,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)local_c0,
             &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssuesCellmlElementTypesLevelsReferenceRulesUrls
            ((vector *)&expectedIssues,(vector *)&gtest_ar,(vector *)local_b0,(vector *)&local_78,
             (vector *)&local_90,(shared_ptr *)local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  std::__cxx11::string::~string(local_30);
  std::
  _Vector_base<libcellml::Issue::ReferenceRule,_std::allocator<libcellml::Issue::ReferenceRule>_>::
  ~_Vector_base(&local_78);
  std::_Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_>::
  ~_Vector_base((_Vector_base<libcellml::Issue::Level,_std::allocator<libcellml::Issue::Level>_> *)
                local_b0);
  std::_Vector_base<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>::
  ~_Vector_base((_Vector_base<libcellml::CellmlElementType,_std::allocator<libcellml::CellmlElementType>_>
                 *)&gtest_ar);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_663);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedIssues);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Analyser, twoEquivalentVoiExternalVariablesIncludingPrimaryVariable)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "Both variable 'time' in component 'environment' and variable 'time' in component 'membrane' are marked as external variables, but they are equivalent to variable 'time' in component 'environment', the primary variable of integration which cannot be used as an external variable.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("environment")->variable("time")));
    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("time")));

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES_CELLMLELEMENTTYPES_LEVELS_REFERENCERULES_URLS(expectedIssues,
                                                                   expectedCellmlElementTypes(expectedIssues.size(), libcellml::CellmlElementType::VARIABLE),
                                                                   expectedLevels(expectedIssues.size(), libcellml::Issue::Level::MESSAGE),
                                                                   expectedReferenceRules(expectedIssues.size(), libcellml::Issue::ReferenceRule::ANALYSER_EXTERNAL_VARIABLE_VOI),
                                                                   expectedUrls(expectedIssues.size(), "https://libcellml.org/documentation/guides/latest/runtime_codes/index?issue=ANALYSER_EXTERNAL_VARIABLE_VOI"),
                                                                   analyser);
}